

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  sqvector<char,_unsigned_int> *this_00;
  LexChar LVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  bool bVar14;
  long lVar15;
  SQInteger SVar16;
  SQUnsignedInteger SVar17;
  SQFloat value;
  SQChar *sTemp;
  char local_45 [5];
  sqvector<char,_unsigned_int> *local_40;
  
  LVar1 = this->_currdata;
  this_00 = &this->_longstr;
  local_45[0] = '\0';
  sqvector<char,_unsigned_int>::resize(this_00,0,local_45);
  uVar8 = this->_currentcolumn;
  sVar12 = this->_sourceTextPtr;
  uVar11 = uVar8;
  do {
    uVar11 = uVar11 + 1;
    if (this->_sourceTextSize <= sVar12) {
      this->_reached_eof = 1;
      this->_currdata = '\0';
      this->_currentcolumn = uVar11;
      if (LVar1 != '0') goto LAB_00136fb4;
      uVar10 = 0;
      goto LAB_00136f66;
    }
    this->_sourceTextPtr = sVar12 + 1;
    bVar9 = this->_sourceText[sVar12];
    uVar10 = (uint)bVar9;
    this->_currdata = bVar9;
    this->_currentcolumn = uVar11;
    uVar13 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar13;
    sVar12 = sVar12 + 1;
  } while (bVar9 == 0x5f);
  if ((LVar1 == '0') && (bVar9 - 0x30 < 10)) {
    iVar4 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_OCTAL_NOT_SUPPORTED,(int32_t)this->_tokenline,iVar4,uVar13 - iVar4);
    uVar10 = (uint)this->_currdata;
  }
  else if (LVar1 != '0') goto LAB_00136fb4;
LAB_00136f66:
  iVar4 = toupper(uVar10);
  if (iVar4 == 0x58) {
    uVar8 = this->_sourceTextPtr;
    SVar16 = this->_currentcolumn;
    do {
      lVar15 = SVar16;
      if (this->_sourceTextSize <= uVar8) {
        this->_reached_eof = 1;
        this->_currdata = '\0';
        this->_currentcolumn = lVar15 + 1;
        bVar9 = 0;
        break;
      }
      this->_sourceTextPtr = uVar8 + 1;
      bVar9 = this->_sourceText[uVar8];
      this->_currdata = bVar9;
      this->_currentcolumn = lVar15 + 1;
      uVar8 = uVar8 + 1;
      SVar16 = lVar15 + 1;
    } while (bVar9 == 0x5f);
    iVar4 = (int)lVar15 + 1;
    iVar5 = isxdigit((uint)bVar9);
    while (iVar5 != 0) {
      uVar10 = (this->_longstr)._allocated;
      uVar13 = (this->_longstr)._size;
      pcVar6 = (this->_longstr)._vals;
      if (uVar10 <= uVar13) {
        uVar2 = uVar13 * 2;
        if (uVar13 * 2 == 0) {
          uVar2 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar6,(ulong)uVar10,(ulong)uVar2
                                      );
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = uVar2;
        uVar13 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar13 + 1;
      pcVar6[uVar13] = bVar9;
      SVar16 = this->_currentcolumn;
      uVar8 = this->_sourceTextPtr;
      do {
        if (this->_sourceTextSize <= uVar8) {
          this->_reached_eof = 1;
          this->_currdata = '\0';
          SVar16 = this->_currentcolumn + 1;
          this->_currentcolumn = SVar16;
          bVar9 = 0;
          break;
        }
        this->_sourceTextPtr = uVar8 + 1;
        bVar9 = this->_sourceText[uVar8];
        this->_currdata = bVar9;
        SVar16 = SVar16 + 1;
        this->_currentcolumn = SVar16;
        uVar8 = uVar8 + 1;
      } while (bVar9 == 0x5f);
      iVar4 = (int)SVar16;
      iVar5 = isxdigit((uint)bVar9);
    }
    uVar10 = (this->_longstr)._size;
    if (0x10 < uVar10) {
      iVar5 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_HEX_TOO_MANY_DIGITS,(int32_t)this->_tokenline,iVar5,iVar4 - iVar5);
      uVar10 = (this->_longstr)._size;
    }
    lVar15 = 3;
    if (uVar10 == 0) {
      iVar4 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_HEX_DIGITS_EXPECTED,(int32_t)this->_tokenline,iVar4,
                 (int)this->_currentcolumn - iVar4);
    }
LAB_00137498:
    uVar10 = (this->_longstr)._allocated;
    uVar13 = (this->_longstr)._size;
    pcVar6 = (this->_longstr)._vals;
    if (uVar10 <= uVar13) {
      SVar17 = 4;
      if (uVar13 * 2 != 0) {
        SVar17 = (SQUnsignedInteger)(uVar13 * 2);
      }
      pcVar6 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar6,(ulong)uVar10,SVar17);
      (this->_longstr)._vals = pcVar6;
      (this->_longstr)._allocated = (size_type)SVar17;
      uVar13 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar13 + 1;
    pcVar6[uVar13] = '\0';
    SVar16 = (*(code *)(&DAT_0017b900 + *(int *)(&DAT_0017b900 + (lVar15 + -1) * 4)))();
    return SVar16;
  }
LAB_00136fb4:
  uVar10 = (this->_longstr)._allocated;
  uVar13 = (this->_longstr)._size;
  pcVar6 = (this->_longstr)._vals;
  local_40 = this_00;
  if (uVar10 <= uVar13) {
    SVar17 = 4;
    if (uVar13 * 2 != 0) {
      SVar17 = (SQUnsignedInteger)(uVar13 * 2);
    }
    pcVar6 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar6,(ulong)uVar10,SVar17);
    (this->_longstr)._vals = pcVar6;
    (this->_longstr)._allocated = (size_type)SVar17;
    uVar13 = (this->_longstr)._size;
  }
  (this->_longstr)._size = uVar13 + 1;
  pcVar6[uVar13] = LVar1;
  bVar9 = this->_currdata;
  lVar15 = 1;
  bVar3 = false;
  bVar14 = false;
LAB_00137024:
  if (bVar9 == 0x2e) {
    if ((bVar14) || (bVar3)) {
      iVar4 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar4,
                 (int)this->_currentcolumn - iVar4);
    }
    bVar14 = true;
    lVar15 = 2;
  }
  else {
    iVar4 = isalnum((uint)bVar9);
    if (iVar4 == 0) goto LAB_00137498;
    if ((bVar9 & 0xdf) == 0x45) {
      if (bVar3) {
        iVar4 = (int)this->_tokencolumn;
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar4,
                   (int)this->_currentcolumn - iVar4);
        bVar9 = this->_currdata;
      }
      uVar10 = (this->_longstr)._allocated;
      uVar13 = (this->_longstr)._size;
      pcVar6 = (this->_longstr)._vals;
      if (uVar10 <= uVar13) {
        uVar2 = uVar13 * 2;
        if (uVar13 * 2 == 0) {
          uVar2 = 4;
        }
        pcVar6 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar6,(ulong)uVar10,(ulong)uVar2
                                      );
        (this->_longstr)._vals = pcVar6;
        (this->_longstr)._allocated = uVar2;
        uVar13 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar13 + 1;
      pcVar6[uVar13] = bVar9;
      uVar8 = this->_sourceTextPtr;
      if (uVar8 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar8 + 1;
        bVar9 = this->_sourceText[uVar8];
        uVar10 = (uint)bVar9;
        lVar15 = this->_currentcolumn + 1;
        this->_currdata = bVar9;
        this->_currentcolumn = lVar15;
        if ((bVar9 == 0x2d) || (bVar9 == 0x2b)) {
          uVar10 = (this->_longstr)._allocated;
          uVar13 = (this->_longstr)._size;
          pcVar6 = (this->_longstr)._vals;
          if (uVar10 <= uVar13) {
            uVar2 = uVar13 * 2;
            if (uVar13 * 2 == 0) {
              uVar2 = 4;
            }
            pcVar6 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar6,(ulong)uVar10,
                                           (ulong)uVar2);
            (this->_longstr)._vals = pcVar6;
            (this->_longstr)._allocated = uVar2;
            uVar13 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar13 + 1;
          pcVar6[uVar13] = bVar9;
          uVar8 = this->_sourceTextPtr;
          if (uVar8 < this->_sourceTextSize) {
            this->_sourceTextPtr = uVar8 + 1;
            uVar10 = (uint)(byte)this->_sourceText[uVar8];
          }
          else {
            this->_reached_eof = 1;
            uVar10 = 0;
          }
          this->_currdata = (LexChar)uVar10;
          lVar15 = this->_currentcolumn + 1;
          this->_currentcolumn = lVar15;
        }
        if (9 < uVar10 - 0x30) goto LAB_0013720c;
      }
      else {
        this->_reached_eof = 1;
        this->_currdata = '\0';
        lVar15 = this->_currentcolumn + 1;
        this->_currentcolumn = lVar15;
LAB_0013720c:
        iVar4 = (int)this->_tokencolumn;
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (this->_ctx,DI_FP_EXP_EXPECTED,(int32_t)this->_tokenline,iVar4,(int)lVar15 - iVar4
                  );
      }
      bVar3 = true;
      lVar15 = 4;
    }
  }
  bVar9 = this->_currdata;
  if ((9 < bVar9 - 0x30) &&
     ((0x37 < bVar9 - 0x2e || ((0x80000000800001U >> ((ulong)(bVar9 - 0x2e) & 0x3f) & 1) == 0)))) {
    iVar4 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar4,
               (int)this->_currentcolumn - iVar4);
    bVar9 = this->_currdata;
  }
  uVar10 = (this->_longstr)._allocated;
  uVar13 = (this->_longstr)._size;
  pcVar6 = (this->_longstr)._vals;
  if (uVar10 <= uVar13) {
    uVar2 = uVar13 * 2;
    if (uVar13 * 2 == 0) {
      uVar2 = 4;
    }
    pcVar6 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar6,(ulong)uVar10,(ulong)uVar2);
    (this->_longstr)._vals = pcVar6;
    (this->_longstr)._allocated = uVar2;
    uVar13 = (this->_longstr)._size;
  }
  (this->_longstr)._size = uVar13 + 1;
  pcVar6[uVar13] = bVar9;
  lVar7 = this->_currentcolumn;
  uVar8 = this->_sourceTextPtr;
  do {
    lVar7 = lVar7 + 1;
    if (this->_sourceTextSize <= uVar8) {
      this->_reached_eof = 1;
      this->_currdata = '\0';
      this->_currentcolumn = this->_currentcolumn + 1;
      bVar9 = 0;
      break;
    }
    this->_sourceTextPtr = uVar8 + 1;
    bVar9 = this->_sourceText[uVar8];
    this->_currdata = bVar9;
    this->_currentcolumn = lVar7;
    uVar8 = uVar8 + 1;
  } while (bVar9 == 0x5f);
  goto LAB_00137024;
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4

    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    volatile SQFloat value;
    INIT_TEMP_STRING();
    NUM_NEXT();
    if(firstchar == _SC('0') && isdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_OCTAL_NOT_SUPPORTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X')) ) {
        NUM_NEXT();
        type = THEX;
        while(isxdigit(CUR_CHAR)) {
            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
        if(_longstr.size() > MAX_HEX_DIGITS)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_TOO_MANY_DIGITS, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(_longstr.size() == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_DIGITS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    }
    else {
        APPEND_CHAR((SQChar)firstchar);
        bool hasExp = false;
        bool hasDot = false;
        while (CUR_CHAR == _SC('.') || isalnum(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.')) {
                if(hasDot || hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasDot = true;
                type = TFLOAT;
            }
            else if(isexponent(CUR_CHAR)) {
                if(hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasExp = true;
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!isdigit(CUR_CHAR))
                    _ctx.reportDiagnostic(DiagnosticsId::DI_FP_EXP_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
            }
            if(!isdigit(CUR_CHAR) && !isexponent(CUR_CHAR) && CUR_CHAR != '.')
                _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);

            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
#if SQ_USE_STD_FROM_CHARS
        {
            auto ret = std::from_chars(&_longstr[0], &_longstr[0] + _longstr.size(), _fvalue);
            if (ret.ec == std::errc::result_out_of_range)
                _ctx.reportDiagnostic(_fvalue == 0 ? DiagnosticsId::DI_LITERAL_UNDERFLOW : DiagnosticsId::DI_LITERAL_OVERFLOW,
                    _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");

            for (const char * c = ret.ptr; c < &_longstr[0] + _longstr.size() - 1; ++c)
                if (*c != '0')
                {
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                }
        }
#else
        value = (SQFloat)strtod(&_longstr[0], &sTemp);
        _fvalue = value;
        if(value == 0)
        {
            for(int i = 0; i < _longstr.size(); i++)
            {
                SQChar c = _longstr[i];
                if (!c || c == 'e' || c == 'E')
                    break;
                if (c != '.' && c != '0')
                    _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_UNDERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
            }
        }
#endif

        if(sizeof(_fvalue) == sizeof(float))
        {
            if (_fvalue >= FLT_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        else if(sizeof(_fvalue) == sizeof(double))
        {
            if (_fvalue >= DBL_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        return TK_FLOAT;
    case TINT:
        if(!LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue))
            _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "integer");
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}